

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void EmitGetObjectProperty
               (RegSlot resultReg,RegSlot objectReg,PropertyId propertyId,
               ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  uint cacheId_00;
  ByteCodeWriter *this;
  uint cacheId;
  FuncInfo *funcInfo_local;
  ByteCodeGenerator *byteCodeGenerator_local;
  PropertyId propertyId_local;
  RegSlot objectReg_local;
  RegSlot resultReg_local;
  
  cacheId_00 = FuncInfo::FindOrAddInlineCacheId(funcInfo,objectReg,propertyId,false,false);
  this = ByteCodeGenerator::Writer(byteCodeGenerator);
  Js::ByteCodeWriter::PatchableProperty(this,LdFld,resultReg,objectReg,cacheId_00,false,false);
  return;
}

Assistant:

void EmitGetObjectProperty(
    Js::RegSlot resultReg,
    Js::RegSlot objectReg,
    Js::PropertyId propertyId,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    uint cacheId = funcInfo->FindOrAddInlineCacheId(
        objectReg,
        propertyId,
        /* isLoadMethod */ false,
        /* isStore */ false);

    byteCodeGenerator->Writer()->PatchableProperty(
        Js::OpCode::LdFld,
        resultReg,
        objectReg,
        cacheId,
        /* isCtor */ false,
        /* registerCacheIdForCall */ false);
}